

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O1

void __thiscall despot::ParticleBelief::Update(ParticleBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  History *this_00;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_01;
  State *pSVar1;
  DSPOMDP *pDVar2;
  Belief *belief;
  double dVar3;
  double dVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  log_ostream *plVar9;
  ostream *poVar10;
  pointer ppSVar11;
  undefined4 extraout_var;
  long lVar12;
  long lVar13;
  ulong uVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar15;
  State *particle;
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  OBS_TYPE o;
  double reward;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_110;
  uint local_f4;
  double local_f0;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_e8;
  History *local_c8;
  OBS_TYPE local_c0;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_b8;
  History local_a0;
  History local_70;
  undefined1 local_38 [8];
  
  this_00 = &(this->super_Belief).history_;
  local_f4 = action;
  local_c0 = obs;
  History::Add(this_00,action,obs);
  uVar5 = local_f4;
  local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (State **)0x0;
  local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (State **)0x0;
  ppSVar11 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c8 = this_00;
  if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppSVar11) {
    local_f0 = 0.0;
  }
  else {
    uVar14 = 0;
    local_f0 = 0.0;
    do {
      pSVar1 = ppSVar11[uVar14];
      pDVar2 = (this->super_Belief).model_;
      local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pSVar1;
      dVar3 = Random::NextDouble((Random *)&Random::RANDOM);
      iVar7 = (*pDVar2->_vptr_DSPOMDP[2])(SUB84(dVar3,0),pDVar2,pSVar1,(ulong)uVar5,local_38);
      pDVar2 = (this->super_Belief).model_;
      (*pDVar2->_vptr_DSPOMDP[7])
                (pDVar2,local_c0,
                 local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,(ulong)uVar5);
      if ((char)iVar7 == '\0' && (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.0) {
        dVar3 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
                *(double *)
                 ((long)local_110.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start + 0x18);
        *(double *)
         ((long)local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_start + 0x18) = dVar3;
        local_f0 = local_f0 + dVar3;
        if (local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(State **)&local_110);
        }
        else {
          *local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (State *)local_110.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        pDVar2 = (this->super_Belief).model_;
        (*pDVar2->_vptr_DSPOMDP[0x17])
                  (pDVar2,local_110.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      }
      uVar14 = uVar14 + 1;
      ppSVar11 = (this->particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->particles_).
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar11 >> 3
                             ));
  }
  iVar7 = logging::level();
  if ((0 < iVar7) && (iVar7 = logging::level(), 3 < iVar7)) {
    plVar9 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar9->super_ostream,"[ParticleBelief::Update] ",0x19);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)plVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," particles survived among ",0x1a);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  this_01 = &this->particles_;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_01,&local_e8);
  dVar3 = local_f0;
  if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    iVar7 = logging::level();
    if ((0 < iVar7) && (iVar7 = logging::level(), 1 < iVar7)) {
      plVar9 = logging::stream(2);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar9->super_ostream,"Particle set is empty!",0x16);
      std::ios::widen((char)(plVar9->super_ostream)._vptr_basic_ostream[-3] + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
    }
    if (this->prior_ == (Belief *)0x0) {
      iVar7 = logging::level();
      if ((0 < iVar7) && (iVar7 = logging::level(), 1 < iVar7)) {
        plVar9 = logging::stream(2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar9->super_ostream,
                   "Resampling by searching initial particles which are consistent with history",
                   0x4b);
        std::ios::widen((char)(plVar9->super_ostream)._vptr_basic_ostream[-3] + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
      iVar7 = this->num_particles_;
      pDVar2 = (this->super_Belief).model_;
      std::vector<int,_std::allocator<int>_>::vector(&local_a0.actions_,&local_c8->actions_);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_a0.observations_,&(this->super_Belief).history_.observations_);
      Resample(&local_110,iVar7,&this->initial_particles_,pDVar2,&local_a0,0);
      iVar7 = (int)&local_110;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign(this_01);
      if ((State *)local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
        uVar14 = (long)local_110.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage -
                 (long)local_110.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
        operator_delete(local_110.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,uVar14);
        iVar7 = (int)uVar14;
      }
      if (local_a0.observations_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        uVar14 = (long)local_a0.observations_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                 (long)local_a0.observations_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        operator_delete(local_a0.observations_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,uVar14);
        iVar7 = (int)uVar14;
      }
    }
    else {
      iVar7 = logging::level();
      if ((0 < iVar7) && (iVar7 = logging::level(), 1 < iVar7)) {
        plVar9 = logging::stream(2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar9->super_ostream,
                   "Resampling by drawing random particles from prior which are consistent with history"
                   ,0x53);
        std::ios::widen((char)(plVar9->super_ostream)._vptr_basic_ostream[-3] + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
      iVar7 = this->num_particles_;
      belief = this->prior_;
      std::vector<int,_std::allocator<int>_>::vector(&local_70.actions_,&local_c8->actions_);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_70.observations_,&(this->super_Belief).history_.observations_);
      Resample(&local_110,iVar7,belief,&local_70,0);
      iVar7 = (int)&local_110;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign(this_01);
      if ((State *)local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
        uVar14 = (long)local_110.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage -
                 (long)local_110.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
        operator_delete(local_110.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,uVar14);
        iVar7 = (int)uVar14;
      }
      local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      if (local_70.observations_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        uVar14 = (long)local_70.observations_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage -
                 (long)local_70.observations_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
        operator_delete(local_70.observations_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,uVar14);
        iVar7 = (int)uVar14;
        local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_70.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
    }
    if (local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar14 = (long)local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      operator_delete(local_a0.actions_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar14);
      iVar7 = (int)uVar14;
    }
    if (((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
         _M_impl.super__Vector_impl_data._M_finish ==
         (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
         _M_impl.super__Vector_impl_data._M_start) && (this->state_indexer_ != (StateIndexer *)0x0))
    {
      iVar8 = logging::level();
      if ((0 < iVar8) && (iVar8 = logging::level(), 1 < iVar8)) {
        plVar9 = logging::stream(2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar9->super_ostream,
                   "Resampling by searching states consistent with last (action, observation) pair",
                   0x4e);
        cVar6 = std::ios::widen((char)(plVar9->super_ostream)._vptr_basic_ostream[-3] + (char)plVar9
                               );
        iVar7 = (int)cVar6;
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
      Resample(&local_110,iVar7,(this->super_Belief).model_,this->state_indexer_,local_f4,local_c0);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::_M_move_assign
                (this_01,&local_110);
      if ((State *)local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
        operator_delete(local_110.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_110.
                              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.
                              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      iVar7 = logging::level();
      if ((0 < iVar7) && (iVar7 = logging::level(), 1 < iVar7)) {
        plVar9 = logging::stream(2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar9->super_ostream,"Resampling failed - Using initial particles",0x2b);
        std::ios::widen((char)(plVar9->super_ostream)._vptr_basic_ostream[-3] + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
      }
      ppSVar11 = (this->initial_particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->initial_particles_).
          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppSVar11) {
        uVar14 = 0;
        do {
          pDVar2 = (this->super_Belief).model_;
          iVar7 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar11[uVar14]);
          local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar7);
          std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)this_01,
                     (State **)&local_110);
          uVar14 = uVar14 + 1;
          ppSVar11 = (this->initial_particles_).
                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)(this->initial_particles_).
                                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar11
                                 >> 3));
      }
    }
    ppSVar11 = (this->particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    lVar12 = (long)(this->particles_).
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ppSVar11;
    if (lVar12 == 0) {
      dVar3 = 0.0;
    }
    else {
      lVar12 = lVar12 >> 3;
      dVar3 = 0.0;
      lVar13 = 0;
      do {
        dVar3 = dVar3 + ppSVar11[lVar13]->weight;
        lVar13 = lVar13 + 1;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar13);
    }
  }
  ppSVar11 = (this->particles_).
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  lVar12 = (long)(this->particles_).
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppSVar11;
  if (lVar12 == 0) {
    dVar4 = 0.0;
  }
  else {
    lVar12 = lVar12 >> 3;
    dVar4 = 0.0;
    lVar13 = 0;
    do {
      pSVar1 = ppSVar11[lVar13];
      dVar15 = pSVar1->weight / dVar3;
      pSVar1->weight = dVar15;
      dVar4 = dVar4 + dVar15 * dVar15;
      lVar13 = lVar13 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar13);
  }
  iVar7 = this->num_particles_;
  if (1.0 / dVar4 < (double)iVar7 * 0.5) {
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_b8,this_01);
    Sample(&local_110,iVar7,&local_b8,(this->super_Belief).model_);
    if (local_b8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ppSVar11 = (this->particles_).
               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar11) {
      uVar14 = 0;
      do {
        pDVar2 = (this->super_Belief).model_;
        (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,ppSVar11[uVar14]);
        uVar14 = uVar14 + 1;
        ppSVar11 = (this->particles_).
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(this->particles_).
                                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar11 >>
                               3));
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_01,&local_110);
    if ((State *)local_110.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
      operator_delete(local_110.
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_110.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ParticleBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	history_.Add(action, obs);

	vector<State*> updated;
	double total_weight = 0;
	double reward;
	OBS_TYPE o;
	// Update particles
	for (int i = 0; i <particles_.size(); i++) {
		State* particle = particles_[i];
		bool terminal = model_->Step(*particle, Random::RANDOM.NextDouble(),
			action, reward, o);
		double prob = model_->ObsProb(obs, *particle, action);

		if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
			particle->weight *= prob;
			total_weight += particle->weight;
			updated.push_back(particle);
		} else {
			model_->Free(particle);
		}
	}

	logd << "[ParticleBelief::Update] " << updated.size()
		<< " particles survived among " << particles_.size() << endl;
	particles_ = updated;

	// Resample if the particle set is empty
	if (particles_.size() == 0) {
		logw << "Particle set is empty!" << endl;
		if (prior_ != NULL) {
			logw
				<< "Resampling by drawing random particles from prior which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, *prior_, history_);
		} else {
			logw
				<< "Resampling by searching initial particles which are consistent with history"
				<< endl;
			particles_ = Resample(num_particles_, initial_particles_, model_,
				history_);
		}

		if (particles_.size() == 0 && state_indexer_ != NULL) {
			logw
				<< "Resampling by searching states consistent with last (action, observation) pair"
				<< endl;
			particles_ = Resample(num_particles_, model_, state_indexer_,
				action, obs);
		}

		if (particles_.size() == 0) {
			logw << "Resampling failed - Using initial particles" << endl;
			for (int i = 0; i < initial_particles_.size(); i ++)
				particles_.push_back(model_->Copy(initial_particles_[i]));
		}

		//Update total weight so that effective number of particles are computed correctly
		total_weight = 0;
                for (int i = 0; i < particles_.size(); i++) {
		    State* particle = particles_[i];
                    total_weight = total_weight + particle->weight;
                }
	}


	double weight_square_sum = 0;
	for (int i = 0; i < particles_.size(); i++) {
		State* particle = particles_[i];
		particle->weight /= total_weight;
		weight_square_sum += particle->weight * particle->weight;
	}

	// Resample if the effective number of particles is "small"
	double num_effective_particles = 1.0 / weight_square_sum;
	if (num_effective_particles < num_particles_ / 2.0) {
		vector<State*> new_belief = Sample(num_particles_, particles_,
			model_);
		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = new_belief;
	}
}